

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicObjectPropertyEnumerator.cpp
# Opt level: O3

DynamicType * __thiscall
Js::DynamicObjectPropertyEnumerator::GetTypeToEnumerate(DynamicObjectPropertyEnumerator *this)

{
  DynamicType *pDVar1;
  
  if ((((this->flags & SnapShotSemantics) == None) ||
      (pDVar1 = (this->initialType).ptr, pDVar1->isLocked != true)) || (DAT_015bf344 == '\0')) {
    pDVar1 = (DynamicType *)(((this->object).ptr)->super_RecyclableObject).type.ptr;
  }
  return pDVar1;
}

Assistant:

DynamicType * DynamicObjectPropertyEnumerator::GetTypeToEnumerate() const
    {
        return
            GetSnapShotSemantics() &&
            initialType->GetIsLocked() &&
            CONFIG_FLAG(TypeSnapshotEnumeration)
            ? PointerValue(initialType)
            : object->GetDynamicType();
    }